

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SingleFileStorageManager::LoadDatabase
          (SingleFileStorageManager *this,StorageOptions storage_options)

{
  string *args_1;
  optional_idx *this_00;
  unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true> *this_01;
  _Head_base<0UL,_duckdb::BlockManager_*,_false> _Var1;
  _Head_base<0UL,_duckdb::TableIOManager_*,_false> _Var2;
  _Head_base<0UL,_duckdb::WriteAheadLog_*,_false> _Var3;
  _Head_base<0UL,_duckdb::BlockManager_*,_false> _Var4;
  _Alloc_hider _Var5;
  _func_int **pp_Var6;
  undefined1 auVar7 [8];
  _Head_base<0UL,_duckdb::TableIOManager_*,_false> _Var8;
  AttachedDatabase *pAVar9;
  bool bVar10;
  byte bVar11;
  int iVar12;
  BufferManager *args;
  type pBVar13;
  FileSystem *fs;
  DBConfig *pDVar14;
  idx_t iVar15;
  pointer pSVar16;
  pointer pBVar17;
  idx_t iVar18;
  NotImplementedException *pNVar19;
  InvalidInputException *pIVar20;
  _Head_base<0UL,_duckdb::BlockManager_*,_false> local_b0;
  idx_t row_group_size;
  string wal_path;
  SingleFileCheckpointReader checkpoint_reader;
  undefined1 local_68 [8];
  undefined8 local_60;
  __native_type local_58;
  
  bVar10 = StorageManager::InMemory(&this->super_StorageManager);
  if (bVar10) {
    args = BufferManager::GetBufferManager((this->super_StorageManager).db);
    wal_path._M_dataplus._M_p = (pointer)0x40000;
    checkpoint_reader.super_CheckpointReader._vptr_CheckpointReader = (_func_int **)0x8;
    make_uniq<duckdb::InMemoryBlockManager,duckdb::BufferManager&,unsigned_long_long,unsigned_long_long>
              ((duckdb *)&local_60,args,(unsigned_long_long *)&wal_path,
               (unsigned_long_long *)&checkpoint_reader);
    _Var4._M_head_impl = local_60;
    local_60 = (BlockManager *)0x0;
    _Var1._M_head_impl =
         (this->block_manager).
         super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
         super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
         super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl;
    (this->block_manager).
    super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
    super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
    super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl = _Var4._M_head_impl;
    if ((_Var1._M_head_impl != (BlockManager *)0x0) &&
       ((**(code **)((long)(_Var1._M_head_impl)->_vptr_BlockManager + 8))(),
       (AttachedDatabase *)local_60 != (AttachedDatabase *)0x0)) {
      (*(((AttachedDatabase *)local_60)->super_CatalogEntry)._vptr_CatalogEntry[1])();
    }
    pBVar13 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
              operator*(&this->block_manager);
    wal_path._M_dataplus._M_p = (pointer)0x1e000;
    make_uniq<duckdb::SingleFileTableIOManager,duckdb::BlockManager&,unsigned_long_long>
              ((duckdb *)&local_60,pBVar13,(unsigned_long_long *)&wal_path);
    _Var8._M_head_impl = (TableIOManager *)local_60;
    local_60 = (BlockManager *)0x0;
    _Var2._M_head_impl =
         (this->table_io_manager).
         super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>
         .super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl;
    (this->table_io_manager).
    super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>.
    super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl = _Var8._M_head_impl;
    if (_Var2._M_head_impl == (TableIOManager *)0x0) {
      return;
    }
    (*(_Var2._M_head_impl)->_vptr_TableIOManager[1])();
    if ((AttachedDatabase *)local_60 == (AttachedDatabase *)0x0) {
      return;
    }
    (*(((AttachedDatabase *)local_60)->super_CatalogEntry)._vptr_CatalogEntry[1])();
    return;
  }
  fs = FileSystem::Get((this->super_StorageManager).db);
  pDVar14 = DBConfig::Get((this->super_StorageManager).db);
  pAVar9 = (AttachedDatabase *)local_60;
  local_58.__data.__kind = -1;
  local_58._20_4_ = 0xffffffff;
  local_58.__data.__list.__prev = (__pthread_internal_list *)0xffffffffffffffff;
  local_58.__align = -1;
  local_58.__size[0x20] = false;
  bVar11 = (this->super_StorageManager).read_only;
  local_60._3_5_ = SUB85(pAVar9,3);
  local_60._0_3_ =
       CONCAT12((pDVar14->options).debug_initialize,
                CONCAT11((pDVar14->options).use_direct_io,bVar11));
  local_58._8_8_ = storage_options.storage_version.index;
  row_group_size = 0x1e000;
  if (storage_options.row_group_size.index != 0xffffffffffffffff) {
    row_group_size = optional_idx::GetIndex(&storage_options.row_group_size);
    if (row_group_size == 0) {
      pNVar19 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&wal_path,
                 "Invalid row group size: %llu - row group size must be bigger than 0",
                 (allocator *)&checkpoint_reader);
      NotImplementedException::NotImplementedException<unsigned_long>
                (pNVar19,&wal_path,row_group_size);
      __cxa_throw(pNVar19,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((row_group_size & 0x7ff) != 0) {
      pNVar19 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&wal_path,
                 "Invalid row group size: %llu - row group size must be divisible by the vector size (%llu)"
                 ,(allocator *)&checkpoint_reader);
      NotImplementedException::NotImplementedException<unsigned_long,unsigned_int>
                (pNVar19,&wal_path,row_group_size,0x800);
      __cxa_throw(pNVar19,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar11 = (this->super_StorageManager).read_only;
  }
  if ((bVar11 & 1) == 0) {
    args_1 = &(this->super_StorageManager).path;
    iVar12 = (*fs->_vptr_FileSystem[0x12])(fs,args_1,0);
    if ((char)iVar12 == '\0') {
      StorageManager::GetWALPath_abi_cxx11_(&wal_path,&this->super_StorageManager);
      iVar12 = (*fs->_vptr_FileSystem[0x12])(fs,&wal_path,0);
      if ((char)iVar12 != '\0') {
        (*fs->_vptr_FileSystem[0x14])(fs,&wal_path,0);
      }
      if (storage_options.block_alloc_size.index == 0xffffffffffffffff) {
        optional_idx::optional_idx
                  ((optional_idx *)&checkpoint_reader,(pDVar14->options).default_block_alloc_size);
        local_58.__align = (long)checkpoint_reader.super_CheckpointReader._vptr_CheckpointReader;
      }
      else {
        iVar15 = optional_idx::GetIndex(&storage_options.block_alloc_size);
        Storage::VerifyBlockAllocSize(iVar15);
        local_58.__align = (long)storage_options.block_alloc_size;
      }
      if (storage_options.block_header_size.index == 0xffffffffffffffff) {
        optional_idx::optional_idx
                  ((optional_idx *)&checkpoint_reader,(pDVar14->options).default_block_header_size);
        local_58.__data.__list.__prev =
             (__pthread_internal_list *)
             checkpoint_reader.super_CheckpointReader._vptr_CheckpointReader;
      }
      else {
        iVar15 = optional_idx::GetIndex(&storage_options.block_header_size);
        Storage::VerifyBlockHeaderSize(iVar15);
        local_58.__data.__list.__prev =
             (__pthread_internal_list *)storage_options.block_header_size.index;
        local_58.__size[0x20] = storage_options.encryption;
        local_58._8_8_ = storage_options.storage_version.index;
      }
      if ((_func_int **)local_58._8_8_ == (_func_int **)0xffffffffffffffff) {
        optional_idx::optional_idx
                  ((optional_idx *)&checkpoint_reader,
                   (pDVar14->options).serialization_compatibility.serialization_version);
        local_58._8_8_ = checkpoint_reader.super_CheckpointReader._vptr_CheckpointReader;
      }
      make_uniq<duckdb::SingleFileBlockManager,duckdb::AttachedDatabase&,std::__cxx11::string&,duckdb::StorageManagerOptions&>
                ((duckdb *)&checkpoint_reader,(this->super_StorageManager).db,args_1,
                 (StorageManagerOptions *)&local_60);
      pSVar16 = unique_ptr<duckdb::SingleFileBlockManager,_std::default_delete<duckdb::SingleFileBlockManager>,_true>
                ::operator->((unique_ptr<duckdb::SingleFileBlockManager,_std::default_delete<duckdb::SingleFileBlockManager>,_true>
                              *)&checkpoint_reader);
      SingleFileBlockManager::CreateNewDatabase(pSVar16);
      pp_Var6 = checkpoint_reader.super_CheckpointReader._vptr_CheckpointReader;
      checkpoint_reader.super_CheckpointReader._vptr_CheckpointReader = (_func_int **)0x0;
      _Var1._M_head_impl =
           (this->block_manager).
           super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
           super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>
           .super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl;
      (this->block_manager).
      super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
      super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
      super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl = (BlockManager *)pp_Var6;
      if (_Var1._M_head_impl != (BlockManager *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_BlockManager + 8))();
      }
      pBVar13 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
                operator*(&this->block_manager);
      make_uniq<duckdb::SingleFileTableIOManager,duckdb::BlockManager&,unsigned_long&>
                ((duckdb *)&local_b0,pBVar13,&row_group_size);
      _Var1._M_head_impl = local_b0._M_head_impl;
      local_b0._M_head_impl = (BlockManager *)0x0;
      _Var2._M_head_impl =
           (this->table_io_manager).
           super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>
           .super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl;
      (this->table_io_manager).
      super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t.
      super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>
      .super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl =
           (TableIOManager *)_Var1._M_head_impl;
      if ((_Var2._M_head_impl != (TableIOManager *)0x0) &&
         ((*(_Var2._M_head_impl)->_vptr_TableIOManager[1])(),
         local_b0._M_head_impl != (BlockManager *)0x0)) {
        (*(local_b0._M_head_impl)->_vptr_BlockManager[1])();
      }
      make_uniq<duckdb::WriteAheadLog,duckdb::AttachedDatabase&,std::__cxx11::string&>
                ((duckdb *)&local_b0,(this->super_StorageManager).db,&wal_path);
      _Var1._M_head_impl = local_b0._M_head_impl;
      local_b0._M_head_impl = (BlockManager *)0x0;
      _Var3._M_head_impl =
           (this->super_StorageManager).wal.
           super_unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>._M_t
           .
           super___uniq_ptr_impl<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::WriteAheadLog_*,_std::default_delete<duckdb::WriteAheadLog>_>
           .super__Head_base<0UL,_duckdb::WriteAheadLog_*,_false>._M_head_impl;
      (this->super_StorageManager).wal.
      super_unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>._M_t.
      super___uniq_ptr_impl<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::WriteAheadLog_*,_std::default_delete<duckdb::WriteAheadLog>_>.
      super__Head_base<0UL,_duckdb::WriteAheadLog_*,_false>._M_head_impl =
           (WriteAheadLog *)_Var1._M_head_impl;
      if ((_Var3._M_head_impl != (WriteAheadLog *)0x0) &&
         ((**(code **)((long)(_Var3._M_head_impl)->_vptr_WriteAheadLog + 8))(),
         local_b0._M_head_impl != (BlockManager *)0x0)) {
        (**(code **)(*(long *)local_b0._M_head_impl + 8))();
      }
      if (checkpoint_reader.super_CheckpointReader._vptr_CheckpointReader != (_func_int **)0x0) {
        (**(code **)(*checkpoint_reader.super_CheckpointReader._vptr_CheckpointReader + 8))();
      }
      ::std::__cxx11::string::~string((string *)&wal_path);
      goto LAB_0158472e;
    }
  }
  this_00 = &storage_options.block_header_size;
  if (storage_options.block_header_size.index == 0xffffffffffffffff) {
    optional_idx::optional_idx
              ((optional_idx *)&wal_path,(pDVar14->options).default_block_header_size);
    local_58.__data.__list.__prev = (__pthread_internal_list *)wal_path._M_dataplus;
  }
  else {
    iVar15 = optional_idx::GetIndex(this_00);
    Storage::VerifyBlockHeaderSize(iVar15);
    local_58.__size[0x20] = storage_options.encryption;
    local_58._8_8_ = storage_options.storage_version.index;
    local_58.__data.__list.__prev = (__pthread_internal_list *)storage_options.block_header_size;
  }
  make_uniq<duckdb::SingleFileBlockManager,duckdb::AttachedDatabase&,std::__cxx11::string&,duckdb::StorageManagerOptions&>
            ((duckdb *)&local_b0,(this->super_StorageManager).db,&(this->super_StorageManager).path,
             (StorageManagerOptions *)&local_60);
  pSVar16 = unique_ptr<duckdb::SingleFileBlockManager,_std::default_delete<duckdb::SingleFileBlockManager>,_true>
            ::operator->((unique_ptr<duckdb::SingleFileBlockManager,_std::default_delete<duckdb::SingleFileBlockManager>,_true>
                          *)&local_b0);
  SingleFileBlockManager::LoadExistingDatabase(pSVar16);
  _Var4._M_head_impl = local_b0._M_head_impl;
  local_b0._M_head_impl = (BlockManager *)0x0;
  this_01 = &this->block_manager;
  _Var1._M_head_impl =
       (this->block_manager).
       super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
       super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
       super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl;
  (this->block_manager).
  super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
  super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var1._M_head_impl != (BlockManager *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_BlockManager + 8))();
  }
  pBVar13 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
            operator*(this_01);
  make_uniq<duckdb::SingleFileTableIOManager,duckdb::BlockManager&,unsigned_long&>
            ((duckdb *)&wal_path,pBVar13,&row_group_size);
  _Var5 = wal_path._M_dataplus;
  wal_path._M_dataplus._M_p = (pointer)0x0;
  _Var2._M_head_impl =
       (this->table_io_manager).
       super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t.
       super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>
       .super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl;
  (this->table_io_manager).
  super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>.
  super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl = (TableIOManager *)_Var5._M_p
  ;
  if ((_Var2._M_head_impl != (TableIOManager *)0x0) &&
     ((*(_Var2._M_head_impl)->_vptr_TableIOManager[1])(), wal_path._M_dataplus._M_p != (pointer)0x0)
     ) {
    (**(code **)(*(long *)wal_path._M_dataplus._M_p + 8))();
  }
  if (storage_options.block_alloc_size.index != 0xffffffffffffffff) {
    iVar15 = optional_idx::GetIndex(&storage_options.block_alloc_size);
    pBVar17 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
              operator->(this_01);
    iVar18 = optional_idx::GetIndex(&pBVar17->block_alloc_size);
    if (iVar15 != iVar18) {
      pIVar20 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&wal_path,
                 "block size parameter does not match the file\'s block size, got %llu, expected %llu"
                 ,(allocator *)&checkpoint_reader);
      iVar15 = optional_idx::GetIndex(&storage_options.block_alloc_size);
      pBVar17 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
                operator->(this_01);
      iVar18 = optional_idx::GetIndex(&pBVar17->block_alloc_size);
      InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
                (pIVar20,&wal_path,iVar15,iVar18);
      __cxa_throw(pIVar20,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  if (storage_options.block_header_size.index != 0xffffffffffffffff) {
    iVar15 = optional_idx::GetIndex(this_00);
    pBVar17 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
              operator->(this_01);
    iVar18 = BlockManager::GetBlockHeaderSize(pBVar17);
    if (iVar15 != iVar18) {
      pIVar20 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&wal_path,
                 "block header size does not match the file\'s block header size, got %llu, expected %llu"
                 ,(allocator *)&checkpoint_reader);
      iVar15 = optional_idx::GetIndex(this_00);
      pBVar17 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
                operator->(this_01);
      iVar18 = BlockManager::GetBlockHeaderSize(pBVar17);
      InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
                (pIVar20,&wal_path,iVar15,iVar18);
      __cxa_throw(pIVar20,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  checkpoint_reader.super_CheckpointReader.catalog =
       Catalog::GetCatalog((this->super_StorageManager).db);
  checkpoint_reader.super_CheckpointReader._vptr_CheckpointReader =
       (_func_int **)&PTR__CheckpointReader_027a0e90;
  checkpoint_reader.storage = this;
  SingleFileCheckpointReader::LoadFromStorage(&checkpoint_reader);
  StorageManager::GetWALPath_abi_cxx11_(&wal_path,&this->super_StorageManager);
  WriteAheadLog::Replay((WriteAheadLog *)local_68,fs,(this->super_StorageManager).db,&wal_path);
  auVar7 = local_68;
  local_68 = (undefined1  [8])0x0;
  _Var3._M_head_impl =
       (this->super_StorageManager).wal.
       super_unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>._M_t.
       super___uniq_ptr_impl<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::WriteAheadLog_*,_std::default_delete<duckdb::WriteAheadLog>_>.
       super__Head_base<0UL,_duckdb::WriteAheadLog_*,_false>._M_head_impl;
  (this->super_StorageManager).wal.
  super_unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>._M_t.
  super___uniq_ptr_impl<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::WriteAheadLog_*,_std::default_delete<duckdb::WriteAheadLog>_>.
  super__Head_base<0UL,_duckdb::WriteAheadLog_*,_false>._M_head_impl = (WriteAheadLog *)auVar7;
  if ((_Var3._M_head_impl != (WriteAheadLog *)0x0) &&
     ((**(code **)((long)(_Var3._M_head_impl)->_vptr_WriteAheadLog + 8))(),
     local_68 != (undefined1  [8])0x0)) {
    (*(*(_func_int ***)local_68)[1])();
  }
  ::std::__cxx11::string::~string((string *)&wal_path);
  if (local_b0._M_head_impl != (BlockManager *)0x0) {
    (**(code **)(*(long *)local_b0._M_head_impl + 8))();
  }
LAB_0158472e:
  if ((0x1e000 < row_group_size) &&
     (iVar15 = optional_idx::GetIndex(&(this->super_StorageManager).storage_version), iVar15 < 4)) {
    pIVar20 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&wal_path,
               "Unsupported row group size %llu - row group sizes >= 122_880 are only supported with STORAGE_VERSION \'1.2.0\' or above.\nExplicitly specify a newer storage version when creating the database to enable larger row groups"
               ,(allocator *)&checkpoint_reader);
    InvalidInputException::InvalidInputException<unsigned_long>(pIVar20,&wal_path,row_group_size);
    __cxa_throw(pIVar20,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  (this->super_StorageManager).load_complete = true;
  return;
}

Assistant:

void SingleFileStorageManager::LoadDatabase(StorageOptions storage_options) {

	if (InMemory()) {
		block_manager = make_uniq<InMemoryBlockManager>(BufferManager::GetBufferManager(db), DEFAULT_BLOCK_ALLOC_SIZE,
		                                                DEFAULT_BLOCK_HEADER_STORAGE_SIZE);
		table_io_manager = make_uniq<SingleFileTableIOManager>(*block_manager, DEFAULT_ROW_GROUP_SIZE);
		return;
	}

	auto &fs = FileSystem::Get(db);
	auto &config = DBConfig::Get(db);

	StorageManagerOptions options;
	options.read_only = read_only;
	options.use_direct_io = config.options.use_direct_io;
	options.debug_initialize = config.options.debug_initialize;
	options.storage_version = storage_options.storage_version;

	idx_t row_group_size = DEFAULT_ROW_GROUP_SIZE;
	if (storage_options.row_group_size.IsValid()) {
		row_group_size = storage_options.row_group_size.GetIndex();
		if (row_group_size == 0) {
			throw NotImplementedException("Invalid row group size: %llu - row group size must be bigger than 0",
			                              row_group_size);
		}
		if (row_group_size % STANDARD_VECTOR_SIZE != 0) {
			throw NotImplementedException(
			    "Invalid row group size: %llu - row group size must be divisible by the vector size (%llu)",
			    row_group_size, STANDARD_VECTOR_SIZE);
		}
	}
	// Check if the database file already exists.
	// Note: a file can also exist if there was a ROLLBACK on a previous transaction creating that file.
	if (!read_only && !fs.FileExists(path)) {
		// file does not exist and we are in read-write mode
		// create a new file

		// check if a WAL file already exists
		auto wal_path = GetWALPath();
		if (fs.FileExists(wal_path)) {
			// WAL file exists but database file does not
			// remove the WAL
			fs.RemoveFile(wal_path);
		}

		// Set the block allocation size for the new database file.
		if (storage_options.block_alloc_size.IsValid()) {
			// Use the option provided by the user.
			Storage::VerifyBlockAllocSize(storage_options.block_alloc_size.GetIndex());
			options.block_alloc_size = storage_options.block_alloc_size;
		} else {
			// No explicit option provided: use the default option.
			options.block_alloc_size = config.options.default_block_alloc_size;
		}
		//! set the block header size for the encrypted database files
		//! set the database to encrypted
		//! update the storage version to 1.3.0
		if (storage_options.block_header_size.IsValid()) {
			// Use the header size for the corresponding encryption algorithm.
			Storage::VerifyBlockHeaderSize(storage_options.block_header_size.GetIndex());
			options.block_header_size = storage_options.block_header_size;
			options.encryption = storage_options.encryption;
			options.storage_version = storage_options.storage_version;
		} else {
			// No encryption; use the default option.
			options.block_header_size = config.options.default_block_header_size;
		}
		if (!options.storage_version.IsValid()) {
			// when creating a new database we default to the serialization version specified in the config
			options.storage_version = config.options.serialization_compatibility.serialization_version;
		}

		// Initialize the block manager before creating a new database.
		auto sf_block_manager = make_uniq<SingleFileBlockManager>(db, path, options);
		sf_block_manager->CreateNewDatabase();
		block_manager = std::move(sf_block_manager);
		table_io_manager = make_uniq<SingleFileTableIOManager>(*block_manager, row_group_size);
		wal = make_uniq<WriteAheadLog>(db, wal_path);
	} else {
		// Either the file exists, or we are in read-only mode, so we
		// try to read the existing file on disk.

		// set the block header size for the encrypted database files
		// (also if they already exist)
		if (storage_options.block_header_size.IsValid()) {
			Storage::VerifyBlockHeaderSize(storage_options.block_header_size.GetIndex());
			options.block_header_size = storage_options.block_header_size;
			options.encryption = storage_options.encryption;
			options.storage_version = storage_options.storage_version;
		} else {
			// No explicit option provided: use the default option.
			options.block_header_size = config.options.default_block_header_size;
		}

		// Initialize the block manager while loading the database file.
		// We'll construct the SingleFileBlockManager with the default block allocation size,
		// and later adjust it when reading the file header.
		auto sf_block_manager = make_uniq<SingleFileBlockManager>(db, path, options);
		sf_block_manager->LoadExistingDatabase();
		block_manager = std::move(sf_block_manager);
		table_io_manager = make_uniq<SingleFileTableIOManager>(*block_manager, row_group_size);

		if (storage_options.block_alloc_size.IsValid()) {
			// user-provided block alloc size
			idx_t block_alloc_size = storage_options.block_alloc_size.GetIndex();
			if (block_alloc_size != block_manager->GetBlockAllocSize()) {
				throw InvalidInputException(
				    "block size parameter does not match the file's block size, got %llu, expected %llu",
				    storage_options.block_alloc_size.GetIndex(), block_manager->GetBlockAllocSize());
			}
		}

		if (storage_options.block_header_size.IsValid()) {
			// block header size for encrypted database files
			idx_t block_header_size = storage_options.block_header_size.GetIndex();
			if (block_header_size != block_manager->GetBlockHeaderSize()) {
				throw InvalidInputException(
				    "block header size does not match the file's block header size, got %llu, expected %llu",
				    storage_options.block_header_size.GetIndex(), block_manager->GetBlockHeaderSize());
			}
		}

		// load the db from storage
		auto checkpoint_reader = SingleFileCheckpointReader(*this);
		checkpoint_reader.LoadFromStorage();

		auto wal_path = GetWALPath();
		wal = WriteAheadLog::Replay(fs, db, wal_path);
	}
	if (row_group_size > 122880ULL && GetStorageVersion() < 4) {
		throw InvalidInputException("Unsupported row group size %llu - row group sizes >= 122_880 are only supported "
		                            "with STORAGE_VERSION '1.2.0' or above.\nExplicitly specify a newer storage "
		                            "version when creating the database to enable larger row groups",
		                            row_group_size);
	}

	load_complete = true;
}